

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_38e3a9::PointerType::printLeft(PointerType *this,OutputStream *s)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ObjCProtoName *objcProto;
  ObjCProtoName *this_00;
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  
  this_00 = (ObjCProtoName *)this->Pointee;
  if ((this_00->super_Node).K == KObjCProtoName) {
    bVar1 = ObjCProtoName::isObjCObject(this_00);
    this_00 = (ObjCProtoName *)this->Pointee;
    if (bVar1) {
      R.Last = "";
      R.First = "id<";
      OutputStream::operator+=(s,R);
      OutputStream::operator+=(s,this_00->Protocol);
      pcVar3 = ">";
      pcVar2 = "";
      goto LAB_0019ca5e;
    }
  }
  (*(this_00->super_Node)._vptr_Node[4])(this_00,s);
  bVar1 = Node::hasArray(this->Pointee,s);
  if (bVar1) {
    R_00.Last = "";
    R_00.First = " ";
    OutputStream::operator+=(s,R_00);
  }
  bVar1 = Node::hasArray(this->Pointee,s);
  if (bVar1) {
LAB_0019ca3a:
    R_01.Last = "";
    R_01.First = "(";
    OutputStream::operator+=(s,R_01);
  }
  else {
    bVar1 = Node::hasFunction(this->Pointee,s);
    if (bVar1) goto LAB_0019ca3a;
  }
  pcVar3 = "*";
  pcVar2 = "";
LAB_0019ca5e:
  R_02.Last = pcVar2;
  R_02.First = pcVar3;
  OutputStream::operator+=(s,R_02);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    // We rewrite objc_object<SomeProtocol>* into id<SomeProtocol>.
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      Pointee->printLeft(s);
      if (Pointee->hasArray(s))
        s += " ";
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += "(";
      s += "*";
    } else {
      const auto *objcProto = static_cast<const ObjCProtoName *>(Pointee);
      s += "id<";
      s += objcProto->Protocol;
      s += ">";
    }
  }